

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

string * common_chat_format_single_abi_cxx11_
                   (string *__return_storage_ptr__,common_chat_templates *tmpls,
                   vector<common_chat_msg,_std::allocator<common_chat_msg>_> *past_msg,
                   common_chat_msg *new_msg,bool add_ass,bool use_jinja)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string fmt_past_msg;
  string fmt_new_msg;
  ostringstream ss;
  undefined1 *local_2f8;
  long local_2f0;
  undefined1 local_2e8 [16];
  char *local_2d8;
  size_type local_2d0;
  char local_2c8 [8];
  undefined8 uStack_2c0;
  common_chat_templates_inputs local_2b8;
  common_chat_params local_230;
  undefined1 local_198 [376];
  
  local_2b8.grammar._M_dataplus._M_p = (pointer)&local_2b8.grammar.field_2;
  local_2b8.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8.grammar._M_string_length = 0;
  local_2b8.grammar.field_2._M_local_buf[0] = '\0';
  local_2b8.json_schema._M_dataplus._M_p = (pointer)&local_2b8.json_schema.field_2;
  local_2b8.json_schema._M_string_length = 0;
  local_2b8.json_schema.field_2._M_local_buf[0] = '\0';
  local_2b8.add_generation_prompt = true;
  local_2b8.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_finish._0_5_ = 0;
  local_2b8.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_finish._5_3_ = 0;
  local_2b8.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
  local_2b8._117_8_ = 0;
  local_2b8.extract_reasoning = true;
  local_2f8 = local_2e8;
  local_2f0 = 0;
  local_2e8[0] = 0;
  local_2b8.use_jinja = use_jinja;
  if ((past_msg->super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (past_msg->super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::operator=
              (&local_2b8.messages,past_msg);
    local_2b8.add_generation_prompt = false;
    common_chat_templates_apply((common_chat_params *)local_198,tmpls,&local_2b8);
    std::__cxx11::string::operator=((string *)&local_2f8,(string *)(local_198 + 8));
    common_chat_params::~common_chat_params((common_chat_params *)local_198);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  if (((add_ass) && (local_2f0 != 0)) && (local_2f8[local_2f0 + -1] == '\n')) {
    std::operator<<((ostream *)local_198,"\n");
  }
  std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::push_back
            (&local_2b8.messages,new_msg);
  local_2b8.add_generation_prompt = add_ass;
  common_chat_templates_apply(&local_230,tmpls,&local_2b8);
  local_2d8 = local_2c8;
  paVar1 = &local_230.prompt.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.prompt._M_dataplus._M_p == paVar1) {
    uStack_2c0 = local_230.prompt.field_2._8_8_;
  }
  else {
    local_2d8 = local_230.prompt._M_dataplus._M_p;
  }
  local_2d0 = local_230.prompt._M_string_length;
  local_230.prompt._M_string_length = 0;
  local_230.prompt.field_2._M_local_buf[0] = '\0';
  local_230.prompt._M_dataplus._M_p = (pointer)paVar1;
  common_chat_params::~common_chat_params(&local_230);
  std::__cxx11::string::substr((ulong)&local_230,(ulong)&local_2d8);
  std::operator<<((ostream *)local_198,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::__cxx11::string::~string((string *)&local_2f8);
  common_chat_templates_inputs::~common_chat_templates_inputs(&local_2b8);
  return __return_storage_ptr__;
}

Assistant:

std::string common_chat_format_single(
        const struct common_chat_templates * tmpls,
        const std::vector<common_chat_msg> & past_msg,
        const common_chat_msg & new_msg,
        bool add_ass,
        bool use_jinja) {

    common_chat_templates_inputs inputs;
    inputs.use_jinja = use_jinja;

    std::string fmt_past_msg;
    if (!past_msg.empty()) {
        inputs.messages = past_msg;
        inputs.add_generation_prompt = false;
        fmt_past_msg = common_chat_templates_apply(tmpls, inputs).prompt;
    }
    std::ostringstream ss;
    // if the past_msg ends with a newline, we must preserve it in the formatted version
    if (add_ass && !fmt_past_msg.empty() && fmt_past_msg.back() == '\n') {
        ss << "\n";
    };
    // format chat with new_msg
    inputs.messages.push_back(new_msg);
    inputs.add_generation_prompt = add_ass;
    auto fmt_new_msg = common_chat_templates_apply(tmpls, inputs).prompt;
    // get the diff part
    ss << fmt_new_msg.substr(fmt_past_msg.size(), fmt_new_msg.size() - fmt_past_msg.size());
    return ss.str();
}